

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.h
# Opt level: O2

void store_coding_context_nonrd(MACROBLOCK *x,PICK_MODE_CONTEXT *ctx)

{
  CANDIDATE_MV *pCVar1;
  CANDIDATE_MV *pCVar2;
  CANDIDATE_MV CVar3;
  CANDIDATE_MV CVar4;
  CANDIDATE_MV CVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  byte bVar9;
  
  bVar9 = (x->txfm_search_info).skip_txfm;
  (ctx->rd_stats).skip_txfm = bVar9;
  ctx->skippable = (uint)bVar9;
  memcpy(ctx,*(x->e_mbd).mi,0xb0);
  ctx->skippable = (uint)(x->txfm_search_info).skip_txfm;
  bVar9 = av1_ref_frame_type((*(x->e_mbd).mi)->ref_frame);
  pCVar1 = (x->mbmi_ext).ref_mv_stack[bVar9];
  CVar3 = pCVar1[1];
  pCVar2 = (x->mbmi_ext).ref_mv_stack[bVar9] + 2;
  CVar4 = *pCVar2;
  CVar5 = pCVar2[1];
  (ctx->mbmi_ext_best).ref_mv_stack[0] = *pCVar1;
  (ctx->mbmi_ext_best).ref_mv_stack[1] = CVar3;
  (ctx->mbmi_ext_best).ref_mv_stack[2] = CVar4;
  (ctx->mbmi_ext_best).ref_mv_stack[3] = CVar5;
  *&(ctx->mbmi_ext_best).weight = (x->mbmi_ext).weight[bVar9];
  (ctx->mbmi_ext_best).mode_context = (x->mbmi_ext).mode_context[bVar9];
  (ctx->mbmi_ext_best).ref_mv_count = (x->mbmi_ext).ref_mv_count[bVar9];
  uVar6 = *(undefined8 *)(x->mbmi_ext).global_mvs;
  uVar7 = *(undefined8 *)((x->mbmi_ext).global_mvs + 2);
  uVar8 = *(undefined8 *)((x->mbmi_ext).global_mvs + 6);
  *(undefined8 *)((ctx->mbmi_ext_best).global_mvs + 4) =
       *(undefined8 *)((x->mbmi_ext).global_mvs + 4);
  *(undefined8 *)((ctx->mbmi_ext_best).global_mvs + 6) = uVar8;
  *(undefined8 *)(ctx->mbmi_ext_best).global_mvs = uVar6;
  *(undefined8 *)((ctx->mbmi_ext_best).global_mvs + 2) = uVar7;
  return;
}

Assistant:

static inline void store_coding_context_nonrd(MACROBLOCK *x,
                                              PICK_MODE_CONTEXT *ctx) {
#endif  // CONFIG_INTERNAL_STATS
  MACROBLOCKD *const xd = &x->e_mbd;
  TxfmSearchInfo *txfm_info = &x->txfm_search_info;

  // Take a snapshot of the coding context so it can be
  // restored if we decide to encode this way
  ctx->rd_stats.skip_txfm = txfm_info->skip_txfm;

  ctx->skippable = txfm_info->skip_txfm;
#if CONFIG_INTERNAL_STATS
  ctx->best_mode_index = mode_index;
#endif  // CONFIG_INTERNAL_STATS
  ctx->mic = *xd->mi[0];
  ctx->skippable = txfm_info->skip_txfm;
  av1_copy_mbmi_ext_to_mbmi_ext_frame(&ctx->mbmi_ext_best, &x->mbmi_ext,
                                      av1_ref_frame_type(xd->mi[0]->ref_frame));
}